

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::createSpvConstant
          (TGlslangToSpvTraverser *this,TIntermTyped *node)

{
  Builder *this_00;
  uint value;
  _func_int **pp_Var1;
  long *plVar2;
  SpvBuildLogger *this_01;
  char cVar3;
  int iVar4;
  int iVar5;
  Id IVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar7;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TType *pTVar8;
  long lVar9;
  TConstUnionArray *consts;
  ulong uVar10;
  int dim;
  int nextConst;
  size_type __dnew;
  string local_58;
  uint *local_38;
  undefined4 extraout_var_05;
  
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
  uVar10 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 8);
  if ((uVar10 & 0x100000000) == 0 && (uVar10 & 0x10000007f) != 2) {
    __assert_fail("node.getQualifier().isConstant()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x288e,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                 );
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
  pp_Var1 = (node->super_TIntermNode)._vptr_TIntermNode;
  if ((*(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0x100000000) == 0) {
    iVar4 = (*pp_Var1[0x11])(node);
    if ((CONCAT44(extraout_var_01,iVar4) == 0) &&
       (iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node),
       CONCAT44(extraout_var_02,iVar4) == 0)) {
      __assert_fail("node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x2893,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                   );
    }
    local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._4_4_ << 0x20);
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])(node);
    lVar9 = 0x88;
    if (CONCAT44(extraout_var_04,iVar5) == 0) {
      lVar9 = 0xc0;
    }
    lVar9 = (**(code **)((long)(node->super_TIntermNode)._vptr_TIntermNode + lVar9))(node);
    consts = (TConstUnionArray *)(lVar9 + 0xb8);
    if (CONCAT44(extraout_var_04,iVar5) == 0) {
      consts = (TConstUnionArray *)(lVar9 + 0x120);
    }
    IVar6 = createSpvConstantFromConstUnionArray
                      (this,(TType *)CONCAT44(extraout_var_03,iVar4),consts,(int *)&local_58,false);
    return IVar6;
  }
  iVar4 = (*pp_Var1[0x1e])(node);
  plVar7 = (long *)CONCAT44(extraout_var_05,iVar4);
  cVar3 = (**(code **)(*plVar7 + 400))(plVar7,4);
  if ((cVar3 != '\0') || (cVar3 = (**(code **)(*plVar7 + 400))(plVar7,5), cVar3 != '\0')) {
    local_58._M_dataplus._M_p._0_4_ = 0x27;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 400))
                    ((long *)CONCAT44(extraout_var_06,iVar4),3);
  if (cVar3 != '\0') {
    local_58._M_dataplus._M_p._0_4_ = 9;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  plVar7 = (long *)CONCAT44(extraout_var_07,iVar4);
  cVar3 = (**(code **)(*plVar7 + 400))(plVar7,6);
  if ((cVar3 != '\0') || (cVar3 = (**(code **)(*plVar7 + 400))(plVar7,7), cVar3 != '\0')) {
    local_58._M_dataplus._M_p._0_4_ = 0x16;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  plVar7 = (long *)CONCAT44(extraout_var_08,iVar4);
  cVar3 = (**(code **)(*plVar7 + 400))(plVar7,10);
  if ((cVar3 != '\0') || (cVar3 = (**(code **)(*plVar7 + 400))(plVar7,0xb), cVar3 != '\0')) {
    local_58._M_dataplus._M_p._0_4_ = 0xb;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 400))
                    ((long *)CONCAT44(extraout_var_09,iVar4),2);
  if (cVar3 != '\0') {
    local_58._M_dataplus._M_p._0_4_ = 10;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_58);
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var_10,iVar4));
  if ((*(uint *)(lVar9 + 8) & 0xff80) == 0x100) {
    local_58._M_dataplus._M_p = (char *)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    this_00 = &this->builder;
    lVar9 = 0;
    do {
      iVar4 = this->glslangIntermediate->localSizeSpecId[lVar9];
      value = this->glslangIntermediate->localSize[lVar9];
      IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this_00,IVar6,value,iVar4 != -1);
      local_38 = (uint *)CONCAT44(local_38._4_4_,IVar6);
      if (local_58._M_string_length == local_58.field_2._M_allocated_capacity) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                   (iterator)local_58._M_string_length,(uint *)&local_38);
      }
      else {
        *(Id *)local_58._M_string_length = IVar6;
        local_58._M_string_length = local_58._M_string_length + 4;
      }
      if (iVar4 != -1) {
        spv::Builder::addDecoration
                  (this_00,*(Id *)(local_58._M_string_length + -4),DecorationSpecId,
                   this->glslangIntermediate->localSizeSpecId[lVar9]);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar6 = spv::Builder::makeVectorType(this_00,IVar6,3);
    IVar6 = spv::Builder::makeCompositeConstant
                      (this_00,IVar6,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,true);
    if (local_58._M_dataplus._M_p == (char *)0x0) {
      return IVar6;
    }
    uVar10 = local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p;
  }
  else {
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
    plVar7 = (long *)CONCAT44(extraout_var_11,iVar4);
    if (plVar7 != (long *)0x0) {
      plVar2 = (long *)plVar7[0x26];
      if (plVar2 == (long *)0x0) {
        local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
        pTVar8 = (TType *)(**(code **)(*plVar7 + 0xf0))(plVar7);
        IVar6 = createSpvConstantFromConstUnionArray
                          (this,pTVar8,(TConstUnionArray *)(plVar7 + 0x24),(int *)&local_58,true);
      }
      else {
        (**(code **)(*plVar2 + 0x10))(plVar2,this);
        pTVar8 = (TType *)(**(code **)(*plVar2 + 0xf0))(plVar2);
        IVar6 = accessChainLoad(this,pTVar8);
      }
      lVar9 = (**(code **)(*plVar7 + 400))(plVar7);
      spv::Builder::addName(&this->builder,IVar6,*(char **)(lVar9 + 8));
      return IVar6;
    }
    this_01 = this->logger;
    local_38 = (uint *)0x31;
    IVar6 = 0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
    local_58.field_2._M_allocated_capacity = (size_type)local_38;
    builtin_strncpy(local_58._M_dataplus._M_p,"Neither a front-end constant nor a spec constant.",
                    0x31);
    local_58._M_string_length = (size_type)local_38;
    local_58._M_dataplus._M_p[(long)local_38] = '\0';
    spv::SpvBuildLogger::missingFunctionality(this_01,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return 0;
    }
    uVar10 = local_58.field_2._M_allocated_capacity + 1;
  }
  operator_delete(local_58._M_dataplus._M_p,uVar10);
  return IVar6;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped& node)
{
    assert(node.getQualifier().isConstant());

    // Handle front-end constants first (non-specialization constants).
    if (! node.getQualifier().specConstant) {
        // hand off to the non-spec-constant path
        assert(node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr);
        int nextConst = 0;
        return createSpvConstantFromConstUnionArray(node.getType(), node.getAsConstantUnion() ?
            node.getAsConstantUnion()->getConstArray() : node.getAsSymbolNode()->getConstArray(),
            nextConst, false);
    }

    // We now know we have a specialization constant to build

    // Extra capabilities may be needed.
    if (node.getType().contains8BitInt())
        builder.addCapability(spv::CapabilityInt8);
    if (node.getType().contains16BitFloat())
        builder.addCapability(spv::CapabilityFloat16);
    if (node.getType().contains16BitInt())
        builder.addCapability(spv::CapabilityInt16);
    if (node.getType().contains64BitInt())
        builder.addCapability(spv::CapabilityInt64);
    if (node.getType().containsDouble())
        builder.addCapability(spv::CapabilityFloat64);

    // gl_WorkGroupSize is a special case until the front-end handles hierarchical specialization constants,
    // even then, it's specialization ids are handled by special case syntax in GLSL: layout(local_size_x = ...
    if (node.getType().getQualifier().builtIn == glslang::EbvWorkGroupSize) {
        std::vector<spv::Id> dimConstId;
        for (int dim = 0; dim < 3; ++dim) {
            bool specConst = (glslangIntermediate->getLocalSizeSpecId(dim) != glslang::TQualifier::layoutNotSet);
            dimConstId.push_back(builder.makeUintConstant(glslangIntermediate->getLocalSize(dim), specConst));
            if (specConst) {
                builder.addDecoration(dimConstId.back(), spv::DecorationSpecId,
                                      glslangIntermediate->getLocalSizeSpecId(dim));
            }
        }
        return builder.makeCompositeConstant(builder.makeVectorType(builder.makeUintType(32), 3), dimConstId, true);
    }

    // An AST node labelled as specialization constant should be a symbol node.
    // Its initializer should either be a sub tree with constant nodes, or a constant union array.
    if (auto* sn = node.getAsSymbolNode()) {
        spv::Id result;
        if (auto* sub_tree = sn->getConstSubtree()) {
            // Traverse the constant constructor sub tree like generating normal run-time instructions.
            // During the AST traversal, if the node is marked as 'specConstant', SpecConstantOpModeGuard
            // will set the builder into spec constant op instruction generating mode.
            sub_tree->traverse(this);
            result = accessChainLoad(sub_tree->getType());
        } else if (auto* const_union_array = &sn->getConstArray()) {
            int nextConst = 0;
            result = createSpvConstantFromConstUnionArray(sn->getType(), *const_union_array, nextConst, true);
        } else {
            logger->missingFunctionality("Invalid initializer for spec onstant.");
            return spv::NoResult;
        }
        builder.addName(result, sn->getName().c_str());
        return result;
    }

    // Neither a front-end constant node, nor a specialization constant node with constant union array or
    // constant sub tree as initializer.
    logger->missingFunctionality("Neither a front-end constant nor a spec constant.");
    return spv::NoResult;
}